

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

offset_type __thiscall foxxll::ufs_file_base::_size(ufs_file_base *this)

{
  offset_type oVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream msg;
  off_t rc;
  ufs_file_base *this_local;
  
  oVar1 = lseek64(this->file_des_,0,2);
  if ((long)oVar1 < 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"Error in ");
    poVar2 = std::operator<<(poVar2,"file::offset_type foxxll::ufs_file_base::_size()");
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,"lseek(fd,0,SEEK_END) path=");
    poVar2 = std::operator<<(poVar2,(string *)&this->filename_);
    poVar2 = std::operator<<(poVar2," fd=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->file_des_);
    poVar2 = std::operator<<(poVar2," : ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    this_00 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(this_00,&local_1c0);
    __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
  }
  return oVar1;
}

Assistant:

file::offset_type ufs_file_base::_size()
{
    // We use lseek SEEK_END to find the file size. This works for raw devices
    // (where stat() returns zero), and we need not reset the position because
    // serve() always lseek()s before read/write.

    off_t rc = ::lseek(file_des_, 0, SEEK_END);
    if (rc < 0)
        FOXXLL_THROW_ERRNO(io_error, "lseek(fd,0,SEEK_END) path=" << filename_ << " fd=" << file_des_);

    // return value is already the total size
    return rc;
}